

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.h
# Opt level: O2

string * __thiscall
rest_rpc::rpc_service::connection::remote_address_abi_cxx11_
          (string *__return_storage_ptr__,connection *this)

{
  address *paVar1;
  address local_60;
  endpoint_type endpoint;
  error_code ec;
  
  if (this->has_closed_ == true) {
    paVar1 = (address *)&endpoint;
  }
  else {
    ec._M_value = 0;
    ec._M_cat = (error_category *)std::_V2::system_category();
    asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>::remote_endpoint
              (&endpoint,&(this->socket_).super_basic_socket<asio::ip::tcp,_asio::any_io_executor>,
               &ec);
    if (ec._M_value == 0) {
      if (endpoint.impl_.data_.base.sa_family != 2) {
        local_60.ipv6_address_.addr_.__in6_u.__u6_addr8[0] = endpoint.impl_.data_._8_1_;
        local_60.ipv6_address_.addr_.__in6_u.__u6_addr8[1] = endpoint.impl_.data_._9_1_;
        local_60.ipv6_address_.addr_.__in6_u.__u6_addr8[2] = endpoint.impl_.data_._10_1_;
        local_60.ipv6_address_.addr_.__in6_u.__u6_addr8[3] = endpoint.impl_.data_._11_1_;
        local_60.ipv6_address_.addr_.__in6_u.__u6_addr8[4] = endpoint.impl_.data_._12_1_;
        local_60.ipv6_address_.addr_.__in6_u.__u6_addr8[5] = endpoint.impl_.data_._13_1_;
        local_60.ipv6_address_.addr_.__in6_u.__u6_addr8[6] = endpoint.impl_.data_._14_1_;
        local_60.ipv6_address_.addr_.__in6_u.__u6_addr8[7] = endpoint.impl_.data_._15_1_;
        local_60.ipv6_address_.addr_.__in6_u._8_8_ = endpoint.impl_.data_._16_8_;
        local_60.ipv6_address_.scope_id_ = endpoint.impl_.data_.v6.sin6_scope_id;
        endpoint.impl_.data_.v6.sin6_flowinfo = 0;
      }
      else {
        local_60.ipv6_address_.addr_.__in6_u.__u6_addr8[0] = '\0';
        local_60.ipv6_address_.addr_.__in6_u.__u6_addr8[1] = '\0';
        local_60.ipv6_address_.addr_.__in6_u.__u6_addr8[2] = '\0';
        local_60.ipv6_address_.addr_.__in6_u.__u6_addr8[3] = '\0';
        local_60.ipv6_address_.addr_.__in6_u.__u6_addr8[4] = '\0';
        local_60.ipv6_address_.addr_.__in6_u.__u6_addr8[5] = '\0';
        local_60.ipv6_address_.addr_.__in6_u.__u6_addr8[6] = '\0';
        local_60.ipv6_address_.addr_.__in6_u.__u6_addr8[7] = '\0';
        local_60.ipv6_address_.addr_.__in6_u._8_8_ = 0;
        local_60.ipv6_address_.scope_id_ = 0;
      }
      local_60.type_ = (anon_enum_32)(endpoint.impl_.data_.base.sa_family != 2);
      local_60.ipv4_address_.addr_.s_addr = endpoint.impl_.data_.v4.sin_addr.s_addr;
      asio::ip::address::to_string_abi_cxx11_(__return_storage_ptr__,&local_60);
      return __return_storage_ptr__;
    }
    paVar1 = &local_60;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string remote_address() const {
    if (has_closed_) {
      return "";
    }

    asio::error_code ec;
    auto endpoint = socket_.remote_endpoint(ec);
    if (ec) {
      return "";
    }
    return endpoint.address().to_string();
  }